

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void DumpBlock(void *b,size_t size,DumpState *D)

{
  lua_State *plVar1;
  int *piVar2;
  int iVar3;
  
  if ((size != 0) && (D->status == 0)) {
    plVar1 = D->L;
    piVar2 = *(int **)&plVar1[-1].hookmask;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(D->L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                    ,0x2f,"void DumpBlock(const void *, size_t, DumpState *)");
    }
    iVar3 = (*D->writer)(plVar1,b,size,D->data);
    D->status = iVar3;
    piVar2 = *(int **)&D->L[-1].hookmask;
    iVar3 = *piVar2;
    *piVar2 = iVar3 + 1;
    if (iVar3 != 0) {
      __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(D->L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                    ,0x31,"void DumpBlock(const void *, size_t, DumpState *)");
    }
  }
  return;
}

Assistant:

static void DumpBlock (const void *b, size_t size, DumpState *D) {
  if (D->status == 0 && size > 0) {
    lua_unlock(D->L);
    D->status = (*D->writer)(D->L, b, size, D->data);
    lua_lock(D->L);
  }
}